

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

MRIStepCoupling MRIStepCoupling_LoadTableByName(char *method)

{
  int **ppiVar1;
  int *piVar2;
  sunrealtype ***pppsVar3;
  sunrealtype **ppsVar4;
  int iVar5;
  ARKodeButcherTable pAVar6;
  sunrealtype *psVar7;
  MRIStepCoupling pMVar8;
  sunrealtype sVar9;
  ARKODE_ERKTableID emethod;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  iVar5 = strcmp("ARKODE_MRI_NONE",method);
  if (iVar5 == 0) {
    return (MRIStepCoupling)0x0;
  }
  iVar5 = strcmp("ARKODE_MRI_GARK_FORWARD_EULER",method);
  if (iVar5 == 0) {
    emethod = ARKODE_FORWARD_EULER_1_1;
  }
  else {
    iVar5 = strcmp("ARKODE_MRI_GARK_RALSTON2",method);
    if (iVar5 == 0) {
      emethod = ARKODE_RALSTON_EULER_2_1_2;
    }
    else {
      iVar5 = strcmp("ARKODE_MIS_KW3",method);
      if (iVar5 == 0) {
        emethod = ARKODE_KNOTH_WOLKE_3_3;
      }
      else {
        iVar5 = strcmp("ARKODE_MRI_GARK_ERK22a",method);
        if (iVar5 == 0) {
          emethod = ARKODE_EXPLICIT_MIDPOINT_EULER_2_1_2;
        }
        else {
          iVar5 = strcmp("ARKODE_MRI_GARK_ERK22b",method);
          if (iVar5 != 0) {
            iVar5 = strcmp("ARKODE_MRI_GARK_ERK33a",method);
            if (iVar5 == 0) {
              pMVar8 = MRIStepCoupling_Alloc(2,4,MRISTEP_EXPLICIT);
              pMVar8->q = 3;
              pMVar8->p = 2;
              psVar7 = pMVar8->c;
              psVar7[1] = 0.3333333333333333;
              psVar7[2] = 0.6666666666666666;
              psVar7[3] = 1.0;
              pppsVar3 = pMVar8->W;
              ppsVar4 = *pppsVar3;
              *ppsVar4[1] = 0.3333333333333333;
              psVar7 = ppsVar4[2];
              *psVar7 = -0.3333333333333333;
              psVar7[1] = 0.6666666666666666;
              psVar7 = ppsVar4[3];
              psVar7[1] = -0.6666666666666666;
              psVar7[2] = 1.0;
              psVar7 = ppsVar4[4];
              *psVar7 = 0.08333333333333333;
              psVar7[1] = -0.3333333333333333;
              psVar7[2] = 0.5833333333333334;
              psVar7 = pppsVar3[1][3];
              *psVar7 = 0.5;
              sVar9 = -0.5;
            }
            else {
              iVar5 = strcmp("ARKODE_MRI_GARK_RALSTON3",method);
              if (iVar5 != 0) {
                iVar5 = strcmp("ARKODE_MRI_GARK_ERK45a",method);
                if (iVar5 == 0) {
                  pMVar8 = MRIStepCoupling_Alloc(2,6,MRISTEP_EXPLICIT);
                  pMVar8->q = 4;
                  pMVar8->p = 3;
                  psVar7 = pMVar8->c;
                  psVar7[1] = 0.2;
                  psVar7[2] = 0.4;
                  psVar7[3] = 0.6;
                  psVar7[4] = 0.8;
                  psVar7[5] = 1.0;
                  pppsVar3 = pMVar8->W;
                  ppsVar4 = *pppsVar3;
                  *ppsVar4[1] = 0.2;
                  psVar7 = ppsVar4[2];
                  *psVar7 = -3.3125;
                  psVar7[1] = 3.5125;
                  psVar7 = ppsVar4[3];
                  *psVar7 = -0.5121234603937985;
                  psVar7[1] = 1.9554969207875972;
                  psVar7[2] = -1.2433734603937985;
                  psVar7 = ppsVar4[4];
                  *psVar7 = -0.10689272115871615;
                  psVar7[1] = -4.6566930569811165;
                  psVar7[2] = 3.994968532757531;
                  psVar7[3] = 0.9686172453823019;
                  psVar7 = ppsVar4[5];
                  *psVar7 = 0.911960843690752;
                  psVar7[1] = -0.1837327083772207;
                  psVar7[2] = -1.1939268660908644;
                  psVar7[3] = -2.6119830068113195;
                  psVar7[4] = 3.2776817375886527;
                  psVar7 = ppsVar4[6];
                  *psVar7 = -1.8585843690752053;
                  psVar7[1] = 2.2246676060069692;
                  psVar7[2] = -0.5244469581796045;
                  psVar7[3] = -0.09396291472257937;
                  psVar7[4] = 0.45232663597042;
                  ppsVar4 = pppsVar3[1];
                  psVar7 = ppsVar4[2];
                  *psVar7 = 6.2875;
                  psVar7[1] = -6.2875;
                  psVar7 = ppsVar4[3];
                  *psVar7 = -0.0382530792124029;
                  psVar7[1] = 0.6952561584248058;
                  psVar7[2] = -0.6570030792124029;
                  psVar7 = ppsVar4[4];
                  *psVar7 = 1.87616694642529;
                  psVar7[1] = 3.0037681973833417;
                  psVar7[2] = -3.0;
                  psVar7[3] = -1.8799351438086316;
                  psVar7 = ppsVar4[5];
                  *psVar7 = -2.4238031914893616;
                  psVar7[1] = 2.0;
                  psVar7[2] = 1.0;
                  psVar7[3] = 5.0;
                  psVar7[4] = -5.576196808510638;
                  psVar7 = ppsVar4[6];
                  uVar10 = 0x4a139bc7;
                  uVar11 = 0x400a7034;
                  uVar12 = 0x4a139bc7;
                  uVar13 = 0xc00a7034;
                  goto LAB_00149b1f;
                }
                iVar5 = strcmp("ARKODE_MRI_GARK_BACKWARD_EULER",method);
                if (iVar5 == 0) {
                  pMVar8 = MRIStepCoupling_Alloc(1,3,MRISTEP_IMPLICIT);
                  pMVar8->q = 1;
                  pMVar8->p = 0;
                  psVar7 = pMVar8->c;
                  psVar7[1] = 1.0;
                  psVar7[2] = 1.0;
                  ppsVar4 = *pMVar8->G;
                  sVar9 = 1.0;
                  *ppsVar4[1] = 1.0;
                  psVar7 = ppsVar4[2];
                  *psVar7 = -1.0;
                }
                else {
                  iVar5 = strcmp("ARKODE_MRI_GARK_IRK21a",method);
                  if (iVar5 == 0) {
                    pAVar6 = ARKodeButcherTable_Alloc(3,1);
                    pAVar6->q = 2;
                    pAVar6->p = 1;
                    psVar7 = pAVar6->c;
                    psVar7[1] = 1.0;
                    psVar7[2] = 1.0;
                    ppsVar4 = pAVar6->A;
                    *ppsVar4[1] = 1.0;
                    psVar7 = ppsVar4[2];
                    *psVar7 = 0.5;
                    psVar7[2] = 0.5;
                    psVar7 = pAVar6->b;
                    *psVar7 = 0.5;
                    psVar7[2] = 0.5;
                    pAVar6->d[2] = 1.0;
                    pMVar8 = MRIStepCoupling_MIStoMRI(pAVar6,2,1);
                    ARKodeButcherTable_Free(pAVar6);
                    return pMVar8;
                  }
                  iVar5 = strcmp("ARKODE_MRI_GARK_IMPLICIT_MIDPOINT",method);
                  if (iVar5 != 0) {
                    iVar5 = strcmp("ARKODE_MRI_GARK_ESDIRK34a",method);
                    if (iVar5 == 0) {
                      pMVar8 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMPLICIT);
                      pMVar8->q = 3;
                      pMVar8->p = 2;
                      psVar7 = pMVar8->c;
                      psVar7[1] = 0.3333333333333333;
                      psVar7[2] = 0.3333333333333333;
                      psVar7[3] = 0.6666666666666666;
                      psVar7[4] = 0.6666666666666666;
                      psVar7[5] = 1.0;
                      psVar7[6] = 1.0;
                      psVar7[7] = 1.0;
                      ppsVar4 = *pMVar8->G;
                      *ppsVar4[1] = 0.3333333333333333;
                      psVar7 = ppsVar4[2];
                      *psVar7 = -0.435866521508459;
                      psVar7[2] = 0.435866521508459;
                      psVar7 = ppsVar4[3];
                      *psVar7 = -0.3045790611944505;
                      psVar7[2] = 0.6379123945277838;
                      psVar7 = ppsVar4[4];
                      *psVar7 = 0.21169131056402665;
                      psVar7[2] = -0.6475578320724856;
                      psVar7[4] = 0.435866521508459;
                      psVar7 = ppsVar4[5];
                      *psVar7 = 0.4454209388055495;
                      psVar7[2] = 0.8813784805616198;
                      psVar7[4] = -0.993466086033836;
                      psVar7 = ppsVar4[6];
                      *psVar7 = -0.435866521508459;
                      psVar7[6] = 0.435866521508459;
                      psVar7 = ppsVar4[8];
                      *psVar7 = 0.24538319991175245;
                      psVar7[2] = 0.4204215033044045;
                      psVar7[4] = -1.5769926063440662;
                      psVar7[6] = 0.9111879031279093;
                      return pMVar8;
                    }
                    iVar5 = strcmp("ARKODE_MRI_GARK_ESDIRK46a",method);
                    if (iVar5 == 0) {
                      pMVar8 = MRIStepCoupling_Alloc(2,0xc,MRISTEP_IMPLICIT);
                      pMVar8->q = 4;
                      pMVar8->p = 3;
                      psVar7 = pMVar8->c;
                      psVar7[1] = 0.2;
                      psVar7[2] = 0.2;
                      psVar7[3] = 0.4;
                      psVar7[4] = 0.4;
                      psVar7[5] = 0.6;
                      psVar7[6] = 0.6;
                      psVar7[7] = 0.8;
                      psVar7[8] = 0.8;
                      psVar7[9] = 1.0;
                      psVar7[10] = 1.0;
                      psVar7[0xb] = 1.0;
                      pppsVar3 = pMVar8->G;
                      ppsVar4 = *pppsVar3;
                      *ppsVar4[1] = 0.2;
                      psVar7 = ppsVar4[2];
                      *psVar7 = -0.25;
                      psVar7[2] = 0.25;
                      psVar7 = ppsVar4[3];
                      *psVar7 = 0.9179311933794375;
                      psVar7[2] = -0.7179311933794374;
                      psVar7 = ppsVar4[4];
                      *psVar7 = 2.6431723539618277;
                      psVar7[2] = -2.8931723539618277;
                      psVar7[4] = 0.25;
                      psVar7 = ppsVar4[5];
                      *psVar7 = 0.501564151341775;
                      psVar7[2] = 0.06834736723773695;
                      psVar7[4] = -0.369911518579512;
                      psVar7 = ppsVar4[6];
                      *psVar7 = 4.342116951031425;
                      psVar7[2] = 0.03897604588394062;
                      psVar7[4] = -4.631092996915365;
                      psVar7[6] = 0.25;
                      psVar7 = ppsVar4[7];
                      *psVar7 = -1.6900149539119083;
                      psVar7[2] = 0.7232372452056922;
                      psVar7[4] = 1.84784916447243;
                      psVar7[6] = -0.681071455766214;
                      psVar7 = ppsVar4[8];
                      *psVar7 = 3.3152679948497616;
                      psVar7[2] = 1.0862351276543005;
                      psVar7[4] = -1.2024240374287367;
                      psVar7[6] = -3.4490790850753257;
                      psVar7[8] = 0.25;
                      psVar7 = ppsVar4[9];
                      *psVar7 = -1.563558636602688;
                      psVar7[2] = 1.0208839548357729;
                      psVar7[4] = 2.4893844266591256;
                      psVar7[6] = -0.18652827667797553;
                      psVar7[8] = -1.5601814682142348;
                      psVar7 = ppsVar4[10];
                      *psVar7 = 0.19;
                      psVar7[2] = -0.24333333333333335;
                      psVar7[4] = 0.42333333333333334;
                      psVar7[6] = 0.42333333333333334;
                      psVar7[8] = -1.0433333333333332;
                      psVar7[10] = 0.25;
                      psVar7 = ppsVar4[0xc];
                      *psVar7 = -0.25;
                      psVar7[2] = 0.6355065879145843;
                      psVar7[4] = -0.27771467514766013;
                      psVar7[6] = -0.4798955020445252;
                      psVar7[8] = 0.5009086778736938;
                      psVar7[10] = -0.1288050885960927;
                      ppsVar4 = pppsVar3[1];
                      psVar7 = ppsVar4[3];
                      *psVar7 = -1.735862386758875;
                      psVar7[2] = 1.735862386758875;
                      psVar7 = ppsVar4[4];
                      *psVar7 = -5.82844997108155;
                      psVar7[2] = 5.82844997108155;
                      psVar7 = ppsVar4[5];
                      *psVar7 = -0.4610230395256553;
                      psVar7[2] = -0.9787999976333687;
                      psVar7[4] = 1.439823037159024;
                      psVar7 = ppsVar4[6];
                      *psVar7 = -7.403989721900906;
                      psVar7[2] = 0.06115468960863698;
                      psVar7[4] = 7.342835032292269;
                      psVar7 = ppsVar4[7];
                      *psVar7 = 2.099785727661873;
                      psVar7[2] = -1.5855812717879028;
                      psVar7[4] = -2.9763473674063983;
                      psVar7[6] = 2.462142911532428;
                      psVar7 = ppsVar4[8];
                      *psVar7 = -5.523652150637583;
                      psVar7[2] = -1.829811152193671;
                      psVar7[4] = 1.8342166973064529;
                      psVar7[6] = 5.519246605524801;
                      psVar7 = ppsVar4[9];
                      *psVar7 = 2.0202334341434356;
                      psVar7[2] = -2.384427012786476;
                      psVar7[4] = -4.40813747576723;
                      psVar7[6] = 0.15196811798180143;
                      psVar7[8] = 4.62036293642847;
                      psVar7 = ppsVar4[10];
                      *psVar7 = 0.12;
                      psVar7[2] = -0.09666666666666666;
                      psVar7[4] = 0.23666666666666666;
                      psVar7[6] = 0.23666666666666666;
                      sVar9 = -0.49666666666666665;
LAB_0014a1db:
                      psVar7[8] = sVar9;
                      return pMVar8;
                    }
                    iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_EULER",method);
                    if (iVar5 == 0) {
                      pMVar8 = MRIStepCoupling_Alloc(1,3,MRISTEP_IMEX);
                      pMVar8->q = 1;
                      pMVar8->p = 0;
                      psVar7 = pMVar8->c;
                      psVar7[1] = 1.0;
                      psVar7[2] = 1.0;
                      sVar9 = 1.0;
                      *(*pMVar8->W)[1] = 1.0;
                      ppsVar4 = *pMVar8->G;
                      *ppsVar4[1] = 1.0;
                      psVar7 = ppsVar4[2];
                      *psVar7 = -1.0;
                      goto LAB_001499ae;
                    }
                    iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_TRAPEZOIDAL",method);
                    if (iVar5 == 0) {
                      pMVar8 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMEX);
                      pMVar8->q = 2;
                      pMVar8->p = 0;
                      psVar7 = pMVar8->c;
                      psVar7[1] = 1.0;
                      psVar7[2] = 1.0;
                      psVar7[3] = 1.0;
                      ppsVar4 = *pMVar8->W;
                      *ppsVar4[1] = 1.0;
                      psVar7 = ppsVar4[3];
                      *psVar7 = -0.5;
                      psVar7[2] = 0.5;
                      ppsVar4 = *pMVar8->G;
                      *ppsVar4[1] = 1.0;
                      psVar7 = ppsVar4[2];
                      *psVar7 = -0.5;
                    }
                    else {
                      iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_MIDPOINT",method);
                      if (iVar5 != 0) {
                        iVar5 = strcmp("ARKODE_IMEX_MRI_GARK3a",method);
                        if (iVar5 == 0) {
                          pMVar8 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMEX);
                          pMVar8->q = 3;
                          pMVar8->p = 0;
                          psVar7 = pMVar8->c;
                          psVar7[1] = 0.435866521508459;
                          psVar7[2] = 0.435866521508459;
                          psVar7[3] = 0.7179332607542295;
                          psVar7[4] = 0.7179332607542295;
                          psVar7[5] = 1.0;
                          psVar7[6] = 1.0;
                          psVar7[7] = 1.0;
                          ppsVar4 = *pMVar8->W;
                          *ppsVar4[1] = 0.435866521508459;
                          psVar7 = ppsVar4[3];
                          *psVar7 = -0.5688715801234401;
                          psVar7[2] = 0.8509383193692106;
                          psVar7 = ppsVar4[4];
                          *psVar7 = 0.4542839446436089;
                          psVar7[2] = -0.4542839446436089;
                          psVar7 = ppsVar4[5];
                          *psVar7 = -0.4271371821005074;
                          psVar7[2] = 0.1562747733103381;
                          psVar7[4] = 0.5529291480359398;
                          psVar7 = ppsVar4[7];
                          *psVar7 = 0.10585829607187965;
                          psVar7[2] = 0.6555675011400702;
                          psVar7[4] = -1.197292318720409;
                          psVar7[6] = 0.435866521508459;
                          ppsVar4 = *pMVar8->G;
                          *ppsVar4[1] = 0.435866521508459;
                          psVar7 = ppsVar4[2];
                          *psVar7 = -0.435866521508459;
                          psVar7[2] = 0.435866521508459;
                          psVar7 = ppsVar4[3];
                          *psVar7 = -0.4103336962288525;
                          psVar7[2] = 0.692400435474623;
                          psVar7 = ppsVar4[4];
                          *psVar7 = 0.4103336962288525;
                          psVar7[2] = -0.8462002177373115;
                          psVar7[4] = 0.435866521508459;
                          psVar7 = ppsVar4[5];
                          *psVar7 = 0.435866521508459;
                          psVar7[2] = 0.9264299099302395;
                          psVar7[4] = -1.080229692192928;
                          psVar7 = ppsVar4[6];
                          *psVar7 = -0.435866521508459;
                        }
                        else {
                          iVar5 = strcmp("ARKODE_IMEX_MRI_GARK3b",method);
                          if (iVar5 != 0) {
                            iVar5 = strcmp("ARKODE_IMEX_MRI_GARK4",method);
                            if (iVar5 == 0) {
                              pMVar8 = MRIStepCoupling_Alloc(2,0xc,MRISTEP_IMEX);
                              pMVar8->q = 4;
                              pMVar8->p = 0;
                              psVar7 = pMVar8->c;
                              psVar7[1] = 0.5;
                              psVar7[2] = 0.5;
                              psVar7[3] = 0.625;
                              psVar7[4] = 0.625;
                              psVar7[5] = 0.75;
                              psVar7[6] = 0.75;
                              psVar7[7] = 0.875;
                              psVar7[8] = 0.875;
                              psVar7[9] = 1.0;
                              psVar7[10] = 1.0;
                              psVar7[0xb] = 1.0;
                              pppsVar3 = pMVar8->W;
                              ppsVar4 = *pppsVar3;
                              *ppsVar4[1] = 0.5;
                              psVar7 = ppsVar4[3];
                              *psVar7 = -1.9171653436366287;
                              psVar7[2] = 2.0421653436366287;
                              psVar7 = ppsVar4[4];
                              *psVar7 = -0.40475103180110594;
                              psVar7[2] = 0.40475103180110594;
                              psVar7 = ppsVar4[5];
                              *psVar7 = 11.451466022492216;
                              psVar7[2] = -30.210757475265044;
                              psVar7[4] = 18.884291452772825;
                              psVar7 = ppsVar4[6];
                              *psVar7 = -0.7090335647602615;
                              psVar7[2] = 1.0303072085875187;
                              psVar7[4] = -0.3212736438272573;
                              psVar7 = ppsVar4[7];
                              *psVar7 = -29.995487164558284;
                              psVar7[2] = 37.6059827749918;
                              psVar7[4] = 0.3212736438272573;
                              psVar7[6] = -7.806769254260774;
                              psVar7 = ppsVar4[8];
                              *psVar7 = 3.104665054272962;
                              psVar7[2] = -2.4303250197571624;
                              psVar7[4] = -1.9054793011515245;
                              psVar7[6] = 1.2311392666357248;
                              psVar7 = ppsVar4[9];
                              *psVar7 = -2.4244295477520477;
                              psVar7[2] = 2.4303250197571624;
                              psVar7[4] = 1.9054793011515245;
                              psVar7[6] = -1.2311392666357248;
                              psVar7[8] = -0.5552355065209142;
                              psVar7 = ppsVar4[10];
                              *psVar7 = -0.010441350444797486;
                              psVar7[2] = 0.07260303614655074;
                              psVar7[4] = -0.1288275951677261;
                              psVar7[6] = 0.11293553500938236;
                              psVar7[8] = -0.04626962554340952;
                              psVar7 = ppsVar4[0xb];
                              *psVar7 = -0.8108522787762101;
                              psVar7[2] = 0.2560073199220492;
                              psVar7[4] = 0.8068294072697528;
                              psVar7[6] = -0.4557148228721824;
                              psVar7[8] = -0.04626962554340952;
                              psVar7[10] = 0.25;
                              ppsVar4 = pppsVar3[1];
                              psVar7 = ppsVar4[3];
                              *psVar7 = 4.084330687273257;
                              psVar7[2] = -4.084330687273257;
                              psVar7 = ppsVar4[5];
                              *psVar7 = -21.843429981382222;
                              psVar7[2] = 59.61201288692787;
                              psVar7[4] = -37.76858290554565;
                              psVar7 = ppsVar4[7];
                              *psVar7 = 61.65904145863709;
                              psVar7[2] = -77.27257996715863;
                              psVar7[6] = 15.613538508521549;
                              psVar7 = ppsVar4[9];
                              *psVar7 = -1.1104710130418285;
                              psVar7[8] = 1.1104710130418285;
                              pppsVar3 = pMVar8->G;
                              ppsVar4 = *pppsVar3;
                              *ppsVar4[1] = 0.5;
                              psVar7 = ppsVar4[2];
                              *psVar7 = -0.25;
                              psVar7[2] = 0.25;
                              psVar7 = ppsVar4[3];
                              *psVar7 = -3.977281248108488;
                              psVar7[2] = 4.102281248108488;
                              psVar7 = ppsVar4[4];
                              *psVar7 = -0.06905388741401691;
                              psVar7[2] = -0.1809461125859831;
                              psVar7[4] = 0.25;
                              psVar7 = ppsVar4[5];
                              *psVar7 = -1.7617676637579205;
                              psVar7[2] = 2.6945246983772986;
                              psVar7[4] = -0.8077570346193781;
                              psVar7 = ppsVar4[6];
                              *psVar7 = 0.555872179155397;
                              psVar7[2] = -0.6799140501579995;
                              psVar7[4] = -0.12595812899739744;
                              psVar7[6] = 0.25;
                              psVar7 = ppsVar4[7];
                              *psVar7 = -5.840176028724956;
                              psVar7[2] = 8.174456684291915;
                              psVar7[4] = 0.12595812899739744;
                              psVar7[6] = -2.3352387845643565;
                              psVar7 = ppsVar4[8];
                              *psVar7 = -1.9067926451678119;
                              psVar7[2] = -1.5470578113851239;
                              psVar7[4] = 4.12988801314935;
                              psVar7[6] = -0.9260375565964145;
                              psVar7[8] = 0.25;
                              psVar7 = ppsVar4[9];
                              *psVar7 = 3.337028151688726;
                              psVar7[2] = 1.5470578113851239;
                              psVar7[4] = -4.12988801314935;
                              psVar7[6] = 0.9260375565964145;
                              psVar7[8] = -1.5552355065209142;
                              psVar7 = ppsVar4[10];
                              *psVar7 = -0.8212936292210076;
                              psVar7[2] = 0.3286103560686;
                              psVar7[4] = 0.6780018121020267;
                              psVar7[6] = -0.34277928786280004;
                              psVar7[8] = -0.09253925108681904;
                              psVar7[10] = 0.25;
                              ppsVar4 = pppsVar3[1];
                              psVar7 = ppsVar4[3];
                              *psVar7 = 8.704562496216976;
                              psVar7[2] = -8.704562496216976;
                              psVar7 = ppsVar4[5];
                              *psVar7 = 3.911643102343875;
                              psVar7[2] = -5.027157171582631;
                              psVar7[4] = 1.1155140692387562;
                              psVar7 = ppsVar4[7];
                              *psVar7 = 10.818607699139118;
                              psVar7[2] = -14.98908526826783;
                              psVar7[6] = 4.170477569128713;
                              psVar7 = ppsVar4[9];
                              *psVar7 = -2.6104710130418285;
                              sVar9 = 2.6104710130418285;
                              goto LAB_0014a1db;
                            }
                            iVar5 = strcmp("ARKODE_IMEX_MRI_SR21",method);
                            if (iVar5 == 0) {
                              pMVar8 = MRIStepCoupling_Alloc(1,4,MRISTEP_SR);
                              pMVar8->q = 2;
                              pMVar8->p = 1;
                              psVar7 = pMVar8->c;
                              psVar7[1] = 0.6;
                              psVar7[2] = 0.26666666666666666;
                              psVar7[3] = 1.0;
                              ppsVar4 = *pMVar8->W;
                              *ppsVar4[1] = 0.6;
                              psVar7 = ppsVar4[2];
                              *psVar7 = 0.08484848484848485;
                              psVar7[1] = 0.18181818181818182;
                              psVar7 = ppsVar4[3];
                              *psVar7 = -0.24074074074074073;
                              psVar7[1] = 0.5074074074074074;
                              psVar7[2] = 0.7333333333333333;
                              psVar7 = ppsVar4[4];
                              *psVar7 = -0.25;
                              psVar7[1] = 0.5;
                              psVar7[2] = 0.75;
                              ppsVar4 = *pMVar8->G;
                              psVar7 = ppsVar4[1];
                              *psVar7 = -0.4782608695652174;
                              psVar7[1] = 0.4782608695652174;
                              psVar7 = ppsVar4[2];
                              *psVar7 = -0.12778064195833572;
                              psVar7[1] = -0.3504802276068817;
                              psVar7[2] = 0.4782608695652174;
                              psVar7 = ppsVar4[3];
                              *psVar7 = 0.12817373657159245;
                              psVar7[1] = -0.9496349237862043;
                              psVar7[2] = 0.34320031764939446;
                              psVar7[3] = 0.4782608695652174;
                              psVar7 = ppsVar4[4];
                              *psVar7 = -2.5833333333333335;
                              psVar7[1] = -0.16666666666666666;
                              sVar9 = 2.75;
                              goto LAB_001499ae;
                            }
                            iVar5 = strcmp("ARKODE_IMEX_MRI_SR32",method);
                            if (iVar5 != 0) {
                              iVar5 = strcmp("ARKODE_IMEX_MRI_SR43",method);
                              if (iVar5 == 0) {
                                pMVar8 = MRIStepCoupling_Alloc(2,7,MRISTEP_SR);
                                pMVar8->q = 4;
                                pMVar8->p = 3;
                                psVar7 = pMVar8->c;
                                psVar7[1] = 0.25;
                                psVar7[2] = 0.75;
                                psVar7[3] = 0.55;
                                psVar7[4] = 0.5;
                                psVar7[5] = 1.0;
                                psVar7[6] = 1.0;
                                pppsVar3 = pMVar8->W;
                                ppsVar4 = *pppsVar3;
                                *ppsVar4[1] = 0.25;
                                psVar7 = ppsVar4[2];
                                *psVar7 = 1.125;
                                psVar7[1] = -0.375;
                                psVar7 = ppsVar4[3];
                                *psVar7 = 0.07991452991452991;
                                psVar7[1] = 0.7777777777777778;
                                psVar7[2] = -0.3076923076923077;
                                psVar7 = ppsVar4[4];
                                *psVar7 = 0.3878787878787879;
                                psVar7[1] = 0.16666666666666666;
                                psVar7[2] = -0.6;
                                psVar7[3] = 0.5454545454545454;
                                psVar7 = ppsVar4[5];
                                *psVar7 = 3.3076249271561773;
                                psVar7[1] = -0.2222222222222222;
                                psVar7[2] = -0.36363636363636365;
                                psVar7[3] = -0.16666666666666666;
                                psVar7[4] = -1.5550996746309247;
                                psVar7 = ppsVar4[6];
                                psVar7[1] = 0.6363636363636364;
                                psVar7[2] = -8.344696969696969;
                                psVar7[3] = 13.667929292929292;
                                psVar7[4] = -7.083333333333333;
                                psVar7[5] = 2.1237373737373737;
                                psVar7 = ppsVar4[7];
                                *psVar7 = 0.0025;
                                psVar7[1] = 4.083333333333333;
                                psVar7[2] = 7.166666666666667;
                                psVar7[3] = -0.7;
                                psVar7[4] = -7.083333333333333;
                                psVar7[5] = -2.4691666666666667;
                                ppsVar4 = pppsVar3[1];
                                psVar7 = ppsVar4[2];
                                *psVar7 = -2.75;
                                psVar7[1] = 2.75;
                                psVar7 = ppsVar4[3];
                                *psVar7 = -0.4198290598290598;
                                psVar7[1] = -0.4088888888888889;
                                psVar7[2] = 0.8287179487179487;
                                psVar7 = ppsVar4[4];
                                *psVar7 = -0.9169340463458111;
                                psVar7[1] = 0.6549019607843137;
                                psVar7[2] = 1.463235294117647;
                                psVar7[3] = -1.2012032085561497;
                                psVar7 = ppsVar4[5];
                                *psVar7 = -6.615249854312355;
                                psVar7[1] = 7.027777777777778;
                                psVar7[2] = -0.5227272727272727;
                                psVar7[3] = 25.333333333333332;
                                psVar7[4] = -25.223133984071485;
                                ppsVar4[6][1] = 0.8106060606060606;
                                ppsVar4 = pMVar8->W[1];
                                psVar7 = ppsVar4[6];
                                psVar7[2] = 14.647727272727273;
                                psVar7[3] = -11.710858585858587;
                                psVar7[5] = -3.7474747474747474;
                                psVar7 = ppsVar4[7];
                                *psVar7 = -0.005;
                                psVar7[1] = -5.708333333333333;
                                psVar7[2] = -14.6875;
                                psVar7[3] = 15.4625;
                                psVar7[5] = 4.9383333333333335;
                                ppsVar4 = *pMVar8->G;
                                psVar7 = ppsVar4[1];
                                *psVar7 = -0.25;
                                psVar7[1] = 0.25;
                                psVar7 = ppsVar4[2];
                                *psVar7 = 0.25;
                                psVar7[1] = -0.5;
                                psVar7[2] = 0.25;
                                psVar7 = ppsVar4[3];
                                *psVar7 = 0.13;
                                psVar7[1] = -0.23333333333333334;
                                psVar7[2] = -0.14666666666666667;
                                psVar7[3] = 0.25;
                                psVar7 = ppsVar4[4];
                                *psVar7 = 0.07058823529411765;
                                psVar7[1] = -0.2213235294117647;
                                psVar7[2] = -0.18198529411764705;
                                psVar7[3] = 0.08272058823529412;
                                psVar7[4] = 0.25;
                                psVar7 = ppsVar4[5];
                                psVar7[1] = -2.25;
                                psVar7[2] = -0.3958333333333333;
                                psVar7[3] = -4.6875;
                                psVar7[4] = 7.083333333333333;
                                psVar7[5] = 0.25;
                                return pMVar8;
                              }
                              iVar5 = strcmp("ARKODE_MERK21",method);
                              if (iVar5 == 0) {
                                pMVar8 = MRIStepCoupling_Alloc(2,3,MRISTEP_MERK);
                                pMVar8->q = 2;
                                pMVar8->p = 1;
                                pMVar8->ngroup = 2;
                                ppiVar1 = pMVar8->group;
                                piVar2 = *ppiVar1;
                                piVar2[0] = 1;
                                piVar2[1] = 3;
                                *ppiVar1[1] = 2;
                                psVar7 = pMVar8->c;
                                psVar7[1] = 0.5;
                                psVar7[2] = 1.0;
                                pppsVar3 = pMVar8->W;
                                ppsVar4 = *pppsVar3;
                                *ppsVar4[1] = 1.0;
                                *ppsVar4[2] = 1.0;
                                *ppsVar4[3] = 1.0;
                                psVar7 = pppsVar3[1][2];
                                uVar10 = 0;
                                uVar11 = 0xc0000000;
                                uVar12 = 0;
                                uVar13 = 0x40000000;
                              }
                              else {
                                iVar5 = strcmp("ARKODE_MERK32",method);
                                if (iVar5 != 0) {
                                  iVar5 = strcmp("ARKODE_MERK43",method);
                                  if (iVar5 != 0) {
                                    iVar5 = strcmp("ARKODE_MERK54",method);
                                    if (iVar5 != 0) {
                                      arkProcessError((ARKodeMem)0x0,-0x16,0x3f,
                                                      "MRIStepCoupling_LoadTableByName",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mri_tables.c"
                                                  ,"Unknown coupling table");
                                      return (MRIStepCoupling)0x0;
                                    }
                                    pMVar8 = MRIStepCoupling_Alloc(4,0xb,MRISTEP_MERK);
                                    pMVar8->q = 5;
                                    pMVar8->p = 4;
                                    pMVar8->ngroup = 5;
                                    ppiVar1 = pMVar8->group;
                                    **ppiVar1 = 1;
                                    piVar2 = ppiVar1[1];
                                    piVar2[0] = 3;
                                    piVar2[1] = 2;
                                    piVar2 = ppiVar1[2];
                                    piVar2[0] = 6;
                                    piVar2[1] = 5;
                                    piVar2[2] = 4;
                                    piVar2 = ppiVar1[3];
                                    piVar2[0] = 8;
                                    piVar2[1] = 9;
                                    piVar2[2] = 7;
                                    piVar2[3] = 0xb;
                                    *ppiVar1[4] = 10;
                                    psVar7 = pMVar8->c;
                                    psVar7[1] = 0.5;
                                    psVar7[2] = 0.5;
                                    psVar7[3] = 0.3333333333333333;
                                    psVar7[4] = 0.5;
                                    psVar7[5] = 0.3333333333333333;
                                    psVar7[6] = 0.25;
                                    psVar7[7] = 0.7;
                                    psVar7[8] = 0.5;
                                    psVar7[9] = 0.6666666666666666;
                                    psVar7[10] = 1.0;
                                    pppsVar3 = pMVar8->W;
                                    ppsVar4 = *pppsVar3;
                                    *ppsVar4[1] = 1.0;
                                    *ppsVar4[2] = 1.0;
                                    *ppsVar4[3] = 1.0;
                                    *ppsVar4[4] = 1.0;
                                    *ppsVar4[5] = 1.0;
                                    *ppsVar4[6] = 1.0;
                                    *ppsVar4[7] = 1.0;
                                    *ppsVar4[8] = 1.0;
                                    *ppsVar4[9] = 1.0;
                                    *ppsVar4[10] = 1.0;
                                    *ppsVar4[0xb] = 1.0;
                                    ppsVar4 = pppsVar3[1];
                                    psVar7 = ppsVar4[2];
                                    *psVar7 = -2.0;
                                    psVar7[1] = 2.0;
                                    psVar7 = ppsVar4[3];
                                    *psVar7 = -2.0;
                                    psVar7[1] = 2.0;
                                    psVar7 = ppsVar4[4];
                                    *psVar7 = -4.999999999999998;
                                    psVar7[2] = -3.9999999999999996;
                                    psVar7[3] = 8.999999999999998;
                                    psVar7 = ppsVar4[5];
                                    *psVar7 = -4.999999999999998;
                                    psVar7[2] = -3.9999999999999996;
                                    psVar7[3] = 8.999999999999998;
                                    psVar7 = ppsVar4[6];
                                    *psVar7 = -4.999999999999998;
                                    psVar7[2] = -3.9999999999999996;
                                    psVar7[3] = 8.999999999999998;
                                    psVar7 = ppsVar4[7];
                                    *psVar7 = -9.000000000000007;
                                    psVar7[4] = 3.9999999999999996;
                                    psVar7[5] = -27.0;
                                    psVar7[6] = 32.00000000000001;
                                    psVar7 = ppsVar4[8];
                                    *psVar7 = -9.000000000000007;
                                    psVar7[4] = 3.9999999999999996;
                                    psVar7[5] = -27.0;
                                    psVar7[6] = 32.00000000000001;
                                    psVar7 = ppsVar4[9];
                                    *psVar7 = -9.000000000000007;
                                    psVar7[4] = 3.9999999999999996;
                                    psVar7[5] = -27.0;
                                    psVar7[6] = 32.00000000000001;
                                    psVar7 = ppsVar4[10];
                                    *psVar7 = -4.928571428571431;
                                    psVar7[7] = 71.42857142857147;
                                    pppsVar3 = pMVar8->W;
                                    ppsVar4 = pppsVar3[1];
                                    psVar7 = ppsVar4[10];
                                    psVar7[8] = 28.000000000000007;
                                    psVar7[9] = -94.50000000000004;
                                    psVar7 = ppsVar4[0xb];
                                    *psVar7 = -9.000000000000007;
                                    psVar7[4] = 3.9999999999999996;
                                    psVar7[5] = -27.0;
                                    psVar7[6] = 32.00000000000001;
                                    ppsVar4 = pppsVar3[2];
                                    psVar7 = ppsVar4[4];
                                    *psVar7 = 5.999999999999998;
                                    psVar7[2] = 11.999999999999998;
                                    psVar7[3] = -17.999999999999996;
                                    psVar7 = ppsVar4[5];
                                    *psVar7 = 5.999999999999998;
                                    psVar7[2] = 11.999999999999998;
                                    psVar7[3] = -17.999999999999996;
                                    psVar7 = ppsVar4[6];
                                    *psVar7 = 5.999999999999998;
                                    psVar7[2] = 11.999999999999998;
                                    psVar7[3] = -17.999999999999996;
                                    psVar7 = ppsVar4[7];
                                    *psVar7 = 26.0;
                                    psVar7[4] = -27.999999999999993;
                                    psVar7[5] = 162.00000000000003;
                                    psVar7[6] = -160.00000000000003;
                                    psVar7 = ppsVar4[8];
                                    *psVar7 = 26.0;
                                    psVar7[4] = -27.999999999999993;
                                    psVar7[5] = 162.00000000000003;
                                    psVar7[6] = -160.00000000000003;
                                    psVar7 = ppsVar4[9];
                                    *psVar7 = 26.0;
                                    psVar7[4] = -27.999999999999993;
                                    psVar7[5] = 162.00000000000003;
                                    psVar7[6] = -160.00000000000003;
                                    psVar7 = ppsVar4[10];
                                    *psVar7 = 7.999999999999943;
                                    psVar7[7] = -250.00000000000009;
                                    psVar7[8] = -82.00000000000004;
                                    psVar7[9] = 324.00000000000017;
                                    psVar7 = ppsVar4[0xb];
                                    *psVar7 = 26.0;
                                    psVar7[4] = -27.999999999999993;
                                    psVar7[5] = 162.00000000000003;
                                    psVar7[6] = -160.00000000000003;
                                    ppsVar4 = pppsVar3[3];
                                    psVar7 = ppsVar4[7];
                                    *psVar7 = -24.000000000000057;
                                    psVar7[4] = 47.99999999999999;
                                    psVar7[5] = -216.0;
                                    psVar7[6] = 192.00000000000006;
                                    psVar7 = ppsVar4[8];
                                    *psVar7 = -24.000000000000057;
                                    psVar7[4] = 47.99999999999999;
                                    ppsVar4 = pMVar8->W[3];
                                    psVar7 = ppsVar4[8];
                                    psVar7[5] = -216.0;
                                    psVar7[6] = 192.00000000000006;
                                    psVar7 = ppsVar4[9];
                                    *psVar7 = -24.000000000000057;
                                    psVar7[4] = 47.99999999999999;
                                    psVar7[5] = -216.0;
                                    psVar7[6] = 192.00000000000006;
                                    psVar7 = ppsVar4[10];
                                    *psVar7 = -4.285714285714278;
                                    psVar7[7] = 214.2857142857144;
                                    psVar7[8] = 60.00000000000002;
                                    psVar7[9] = -270.0000000000001;
                                    psVar7 = ppsVar4[0xb];
                                    *psVar7 = -24.000000000000057;
                                    psVar7[4] = 47.99999999999999;
                                    psVar7[5] = -216.0;
                                    psVar7[6] = 192.00000000000006;
                                    return pMVar8;
                                  }
                                  pMVar8 = MRIStepCoupling_Alloc(3,7,MRISTEP_MERK);
                                  pMVar8->q = 4;
                                  pMVar8->p = 3;
                                  pMVar8->ngroup = 4;
                                  ppiVar1 = pMVar8->group;
                                  **ppiVar1 = 1;
                                  piVar2 = ppiVar1[1];
                                  piVar2[0] = 3;
                                  piVar2[1] = 2;
                                  piVar2 = ppiVar1[2];
                                  piVar2[0] = 5;
                                  piVar2[1] = 4;
                                  piVar2[2] = 7;
                                  *ppiVar1[3] = 6;
                                  psVar7 = pMVar8->c;
                                  psVar7[1] = 0.5;
                                  psVar7[2] = 0.5;
                                  psVar7[3] = 0.3333333333333333;
                                  psVar7[4] = 0.8333333333333334;
                                  psVar7[5] = 0.3333333333333333;
                                  psVar7[6] = 1.0;
                                  pppsVar3 = pMVar8->W;
                                  ppsVar4 = *pppsVar3;
                                  *ppsVar4[1] = 1.0;
                                  *ppsVar4[2] = 1.0;
                                  *ppsVar4[3] = 1.0;
                                  *ppsVar4[4] = 1.0;
                                  *ppsVar4[5] = 1.0;
                                  *ppsVar4[6] = 1.0;
                                  *ppsVar4[7] = 1.0;
                                  ppsVar4 = pppsVar3[1];
                                  psVar7 = ppsVar4[2];
                                  *psVar7 = -2.0;
                                  psVar7[1] = 2.0;
                                  psVar7 = ppsVar4[3];
                                  *psVar7 = -2.0;
                                  psVar7[1] = 2.0;
                                  psVar7 = ppsVar4[4];
                                  *psVar7 = -4.999999999999998;
                                  psVar7[2] = -3.9999999999999996;
                                  psVar7[3] = 8.999999999999998;
                                  psVar7 = ppsVar4[5];
                                  *psVar7 = -4.999999999999998;
                                  psVar7[2] = -3.9999999999999996;
                                  psVar7[3] = 8.999999999999998;
                                  psVar7 = ppsVar4[6];
                                  *psVar7 = -4.200000000000001;
                                  psVar7[4] = -0.7999999999999999;
                                  psVar7[5] = 5.000000000000001;
                                  psVar7 = ppsVar4[7];
                                  *psVar7 = -4.999999999999998;
                                  psVar7[2] = -3.9999999999999996;
                                  psVar7[3] = 8.999999999999998;
                                  ppsVar4 = pppsVar3[2];
                                  psVar7 = ppsVar4[4];
                                  *psVar7 = 5.999999999999998;
                                  uVar10 = 0xffffffff;
                                  uVar11 = 0x4027ffff;
                                  uVar12 = 0xffffffff;
                                  uVar13 = 0xc031ffff;
                                  *(undefined4 *)(psVar7 + 2) = 0xffffffff;
                                  *(undefined4 *)((long)psVar7 + 0x14) = 0x4027ffff;
                                  *(undefined4 *)(psVar7 + 3) = 0xffffffff;
                                  *(undefined4 *)((long)psVar7 + 0x1c) = 0xc031ffff;
                                  psVar7 = ppsVar4[5];
                                  *psVar7 = 5.999999999999998;
                                  *(undefined4 *)(psVar7 + 2) = 0xffffffff;
                                  *(undefined4 *)((long)psVar7 + 0x14) = 0x4027ffff;
                                  *(undefined4 *)(psVar7 + 3) = 0xffffffff;
                                  *(undefined4 *)((long)psVar7 + 0x1c) = 0xc031ffff;
                                  psVar7 = ppsVar4[6];
                                  *psVar7 = 3.6;
                                  psVar7[4] = 2.4;
                                  psVar7[5] = -6.0;
                                  psVar7 = ppsVar4[7];
                                  *psVar7 = 5.999999999999998;
                                  goto LAB_0014aed2;
                                }
                                pMVar8 = MRIStepCoupling_Alloc(2,4,MRISTEP_MERK);
                                pMVar8->q = 3;
                                pMVar8->p = 2;
                                pMVar8->ngroup = 3;
                                ppiVar1 = pMVar8->group;
                                **ppiVar1 = 1;
                                piVar2 = ppiVar1[1];
                                piVar2[0] = 2;
                                piVar2[1] = 4;
                                *ppiVar1[2] = 3;
                                psVar7 = pMVar8->c;
                                psVar7[1] = 0.5;
                                psVar7[2] = 0.6666666666666666;
                                psVar7[3] = 1.0;
                                pppsVar3 = pMVar8->W;
                                ppsVar4 = *pppsVar3;
                                *ppsVar4[1] = 1.0;
                                *ppsVar4[2] = 1.0;
                                *ppsVar4[3] = 1.0;
                                *ppsVar4[4] = 1.0;
                                ppsVar4 = pppsVar3[1];
                                psVar7 = ppsVar4[2];
                                uVar10 = 0;
                                uVar11 = 0xc0000000;
                                uVar12 = 0;
                                uVar13 = 0x40000000;
                                *(undefined4 *)psVar7 = 0;
                                *(undefined4 *)((long)psVar7 + 4) = 0xc0000000;
                                *(undefined4 *)(psVar7 + 1) = 0;
                                *(undefined4 *)((long)psVar7 + 0xc) = 0x40000000;
                                psVar7 = ppsVar4[3];
                                *psVar7 = -1.5;
                                psVar7[2] = 1.5;
                                psVar7 = ppsVar4[4];
                              }
LAB_00149b1f:
                              *(undefined4 *)psVar7 = uVar10;
                              *(undefined4 *)((long)psVar7 + 4) = uVar11;
                              *(undefined4 *)(psVar7 + 1) = uVar12;
                              *(undefined4 *)((long)psVar7 + 0xc) = uVar13;
                              return pMVar8;
                            }
                            pMVar8 = MRIStepCoupling_Alloc(2,5,MRISTEP_SR);
                            pMVar8->q = 3;
                            pMVar8->p = 2;
                            psVar7 = pMVar8->c;
                            psVar7[1] = 0.6764705882352942;
                            psVar7[2] = 0.8;
                            psVar7[3] = 1.1333333333333333;
                            psVar7[4] = 1.0;
                            pppsVar3 = pMVar8->W;
                            ppsVar4 = *pppsVar3;
                            *ppsVar4[1] = 0.6764705882352942;
                            psVar7 = ppsVar4[2];
                            *psVar7 = 1.0142857142857142;
                            psVar7[1] = -0.21428571428571427;
                            psVar7 = ppsVar4[3];
                            *psVar7 = 0.10735930735930736;
                            psVar7[1] = 0.5714285714285714;
                            psVar7[2] = 0.45454545454545453;
                            psVar7 = ppsVar4[4];
                            *psVar7 = 0.8641357630008525;
                            psVar7[1] = 0.08623188405797101;
                            psVar7[2] = 0.34375;
                            psVar7[3] = -0.29411764705882354;
                            psVar7 = ppsVar4[5];
                            *psVar7 = 1.0203249859689445;
                            psVar7[1] = -1.4838709677419355;
                            psVar7[2] = 1.9705882352941178;
                            psVar7[3] = -0.5070422535211268;
                            ppsVar4 = pppsVar3[1];
                            psVar7 = ppsVar4[2];
                            *psVar7 = -0.2264473168820995;
                            psVar7[1] = 0.2264473168820995;
                            psVar7 = ppsVar4[3];
                            *psVar7 = -1.7415039794633156;
                            psVar7[1] = 8.210746794478919;
                            psVar7[2] = -6.469242815015602;
                            psVar7 = ppsVar4[4];
                            *psVar7 = -1.2954512170341839;
                            psVar7[1] = 2.560595940177763;
                            psVar7[2] = -2.104988533033297;
                            psVar7[3] = 0.8398438098897179;
                            psVar7 = ppsVar4[5];
                            *psVar7 = -1.6386815830309893;
                            psVar7[1] = 6.0831260274754335;
                            psVar7[2] = -5.777777777777778;
                            psVar7[3] = 1.3333333333333333;
                            ppsVar4 = *pMVar8->G;
                            psVar7 = ppsVar4[1];
                            *psVar7 = -0.5714285714285714;
                            psVar7[1] = 0.5714285714285714;
                            psVar7 = ppsVar4[2];
                            *psVar7 = -0.8655695979919582;
                            psVar7[1] = 0.2941410265633868;
                            psVar7[2] = 0.5714285714285714;
                            psVar7 = ppsVar4[3];
                            *psVar7 = 1.211752194844657;
                            psVar7[1] = -2.2377262208186828;
                            psVar7[2] = 0.45454545454545453;
                            psVar7[3] = 0.5714285714285714;
                            psVar7 = ppsVar4[4];
                            *psVar7 = 0.021355814748372136;
                            psVar7[1] = -0.07308298152405064;
                            psVar7[2] = -0.20101452403881268;
                            psVar7[3] = -0.31868688061408024;
                            psVar7[4] = 0.5714285714285714;
                            psVar7 = ppsVar4[5];
                            *psVar7 = -0.043236714975845414;
                            psVar7[1] = 0.05514147688060732;
                            uVar10 = 0x92492492;
                            uVar11 = 0x3fb24924;
                            uVar12 = 0x55555555;
                            uVar13 = 0xbfb55555;
LAB_0014aed2:
                            *(undefined4 *)(psVar7 + 2) = uVar10;
                            *(undefined4 *)((long)psVar7 + 0x14) = uVar11;
                            *(undefined4 *)(psVar7 + 3) = uVar12;
                            *(undefined4 *)((long)psVar7 + 0x1c) = uVar13;
                            return pMVar8;
                          }
                          pMVar8 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMEX);
                          pMVar8->q = 3;
                          pMVar8->p = 0;
                          psVar7 = pMVar8->c;
                          psVar7[1] = 0.435866521508459;
                          psVar7[2] = 0.435866521508459;
                          psVar7[3] = 0.7179332607542295;
                          psVar7[4] = 0.7179332607542295;
                          psVar7[5] = 1.0;
                          psVar7[6] = 1.0;
                          psVar7[7] = 1.0;
                          ppsVar4 = *pMVar8->W;
                          *ppsVar4[1] = 0.435866521508459;
                          psVar7 = ppsVar4[3];
                          *psVar7 = -0.17501452855704677;
                          psVar7[2] = 0.45708126780281727;
                          psVar7 = ppsVar4[4];
                          *psVar7 = 0.06042689307721552;
                          psVar7[2] = -0.06042689307721552;
                          psVar7 = ppsVar4[5];
                          *psVar7 = 0.11952139594254545;
                          psVar7[2] = -1.843725226689662;
                          psVar7[4] = 2.006270569992887;
                          psVar7 = ppsVar4[6];
                          *psVar7 = -0.5466585780430528;
                          psVar7[2] = 2.0;
                          psVar7[4] = -1.4533414219569472;
                          psVar7 = ppsVar4[7];
                          *psVar7 = 0.10585829607187965;
                          psVar7[2] = 0.6555675011400702;
                          psVar7[4] = -1.197292318720409;
                          psVar7[6] = 0.435866521508459;
                          ppsVar4 = *pMVar8->G;
                          *ppsVar4[1] = 0.435866521508459;
                          psVar7 = ppsVar4[2];
                          *psVar7 = -0.435866521508459;
                          psVar7[2] = 0.435866521508459;
                          psVar7 = ppsVar4[3];
                          *psVar7 = 0.04142737535644148;
                          psVar7[2] = 0.24063936388932902;
                          psVar7 = ppsVar4[4];
                          *psVar7 = -0.04142737535644148;
                          psVar7[2] = -0.39443914615201753;
                          psVar7[4] = 0.435866521508459;
                          psVar7 = ppsVar4[5];
                          *psVar7 = 0.11233731430060478;
                          psVar7[2] = 1.051807513648115;
                          psVar7[4] = -0.8820780887029493;
                          psVar7 = ppsVar4[6];
                          *psVar7 = -0.11233731430060478;
                          psVar7[2] = -0.12537760371787546;
                          psVar7[4] = -0.19815160348997876;
                        }
                        psVar7[6] = 0.435866521508459;
                        return pMVar8;
                      }
                      pMVar8 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMEX);
                      pMVar8->q = 2;
                      pMVar8->p = 0;
                      psVar7 = pMVar8->c;
                      psVar7[1] = 0.5;
                      psVar7[2] = 0.5;
                      psVar7[3] = 1.0;
                      ppsVar4 = *pMVar8->W;
                      *ppsVar4[1] = 0.5;
                      psVar7 = ppsVar4[3];
                      *psVar7 = -0.5;
                      psVar7[2] = 1.0;
                      ppsVar4 = *pMVar8->G;
                      *ppsVar4[1] = 0.5;
                      psVar7 = ppsVar4[2];
                      *psVar7 = -0.5;
                      psVar7[2] = 0.5;
                      psVar7 = ppsVar4[3];
                    }
                    psVar7[2] = 0.5;
                    return pMVar8;
                  }
                  pMVar8 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMPLICIT);
                  pMVar8->q = 2;
                  pMVar8->p = 0;
                  psVar7 = pMVar8->c;
                  psVar7[1] = 0.5;
                  psVar7[2] = 0.5;
                  psVar7[3] = 1.0;
                  ppsVar4 = *pMVar8->G;
                  sVar9 = 0.5;
                  *ppsVar4[1] = 0.5;
                  psVar7 = ppsVar4[2];
                  *psVar7 = -0.5;
                  psVar7[2] = 0.5;
                  psVar7 = ppsVar4[3];
                }
                psVar7[2] = sVar9;
                return pMVar8;
              }
              pMVar8 = MRIStepCoupling_Alloc(2,4,MRISTEP_EXPLICIT);
              pMVar8->q = 3;
              pMVar8->p = 2;
              psVar7 = pMVar8->c;
              psVar7[1] = 0.5;
              psVar7[2] = 0.75;
              psVar7[3] = 1.0;
              pppsVar3 = pMVar8->W;
              ppsVar4 = *pppsVar3;
              *ppsVar4[1] = 0.5;
              psVar7 = ppsVar4[2];
              *psVar7 = -2.75;
              psVar7[1] = 3.0;
              psVar7 = ppsVar4[3];
              *psVar7 = 1.3055555555555556;
              psVar7[1] = -0.16666666666666666;
              psVar7[2] = -0.8888888888888888;
              psVar7 = ppsVar4[4];
              *psVar7 = 0.025;
              psVar7[1] = 0.175;
              psVar7[2] = 0.05;
              ppsVar4 = pppsVar3[1];
              psVar7 = ppsVar4[2];
              *psVar7 = 4.5;
              psVar7[1] = -4.5;
              psVar7 = ppsVar4[3];
              *psVar7 = -2.1666666666666665;
              psVar7[1] = -0.5;
              sVar9 = 2.6666666666666665;
            }
LAB_001499ae:
            psVar7[2] = sVar9;
            return pMVar8;
          }
          emethod = ARKODE_HEUN_EULER_2_1_2;
        }
      }
    }
  }
  pAVar6 = ARKodeButcherTable_LoadERK(emethod);
  pMVar8 = MRIStepCoupling_MIStoMRI(pAVar6,pAVar6->q,pAVar6->p);
  ARKodeButcherTable_Free(pAVar6);
  return pMVar8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_LoadTableByName(const char* method)
{
#define ARK_MRI_TABLE(name, coeff) \
  if (strcmp(#name, method) == 0) coeff
#include "arkode_mri_tables.def"
#undef ARK_MRI_TABLE

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown coupling table");

  return NULL;
}